

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadPool.cpp
# Opt level: O3

int __thiscall
IlmThread_3_2::anon_unknown_5::DefaultThreadPoolProvider::numThreads
          (DefaultThreadPoolProvider *this)

{
  return (((this->_data).
           super___shared_ptr<IlmThread_3_2::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr)->_threadCount).super___atomic_base<int>._M_i;
}

Assistant:

int
DefaultThreadPoolProvider::numThreads () const
{
    return _data->_threadCount.load ();
}